

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::writeSkeleton(Application *this,char *filename,Scene *scene)

{
  Skeleton *this_00;
  long lVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  int iVar4;
  string filenameNoExt;
  stringstream outfilename;
  string asStack_1f8 [32];
  char *local_1d8 [4];
  allocator local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::string::string(asStack_1f8,filename,local_1b8);
  iVar4 = 0;
  std::__cxx11::string::find((char *)asStack_1f8,0x1f04f1);
  std::__cxx11::string::substr((ulong)local_1b8,(ulong)asStack_1f8);
  std::__cxx11::string::operator=(asStack_1f8,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  for (p_Var3 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (*(long *)(p_Var3 + 1) != 0) {
      lVar1 = __dynamic_cast(*(long *)(p_Var3 + 1),&DynamicScene::SceneObject::typeinfo,
                             &DynamicScene::Mesh::typeinfo,0);
      if (lVar1 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar2 = std::operator<<(local_1a8,asStack_1f8);
        poVar2 = std::operator<<(poVar2,"_");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
        std::operator<<(poVar2,"_skel.xml");
        this_00 = *(Skeleton **)(lVar1 + 0x168);
        std::__cxx11::stringbuf::str();
        DynamicScene::Skeleton::save(this_00,local_1d8[0]);
        std::__cxx11::string::~string((string *)local_1d8);
        iVar4 = iVar4 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      }
    }
  }
  std::__cxx11::string::~string(asStack_1f8);
  return;
}

Assistant:

void CMU462::Application::writeSkeleton(const char *filename,
                                        const DynamicScene::Scene *scene) {
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects) {
    DynamicScene::Mesh *mesh = dynamic_cast<DynamicScene::Mesh *>(object);
    if (mesh) {
      stringstream outfilename;
      outfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      mesh->skeleton->save(outfilename.str().c_str());
      meshID++;
    }
  }
}